

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

QLayoutItem * __thiscall QFormLayout::takeAt(QFormLayout *this,int index)

{
  ItemMatrix *m;
  long lVar1;
  int iVar2;
  QFormLayoutItem **ppQVar3;
  QLayoutItem *pQVar4;
  QFormLayoutItem *pQVar5;
  ulong i;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  m = (ItemMatrix *)(lVar1 + 0xc0);
  i = (ulong)index;
  if (i < *(ulong *)(lVar1 + 0xe8)) {
    pQVar5 = *(QFormLayoutItem **)(*(long *)(lVar1 + 0xe0) + i * 8);
  }
  else {
    pQVar5 = (QFormLayoutItem *)0x0;
  }
  iVar2 = storageIndexFromLayoutItem(m,pQVar5);
  if (iVar2 == -1) {
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_40 = "default";
    QMessageLogger::warning(local_58,"QFormLayout::takeAt: Invalid index %d",index);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (QLayoutItem *)0x0;
    }
  }
  else {
    ppQVar3 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()(m,iVar2 / 2,iVar2 % 2);
    pQVar5 = *ppQVar3;
    QList<QFormLayoutItem_*>::removeAt((QList<QFormLayoutItem_*> *)(lVar1 + 0xd8),i);
    ppQVar3 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()(m,iVar2 / 2,iVar2 % 2);
    *ppQVar3 = (QFormLayoutItem *)0x0;
    (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      pQVar4 = ownershipCleanedItem(pQVar5,this);
      return pQVar4;
    }
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QFormLayout::takeAt(int index)
{
    Q_D(QFormLayout);

    const int storageIndex = storageIndexFromLayoutItem(d->m_matrix, d->m_things.value(index));
    if (Q_UNLIKELY(storageIndex == -1)) {
        qWarning("QFormLayout::takeAt: Invalid index %d", index);
        return nullptr;
    }

    int row, col;
    QFormLayoutPrivate::ItemMatrix::storageIndexToPosition(storageIndex, &row, &col);
    Q_ASSERT(d->m_matrix(row, col));

    QFormLayoutItem *item = d->m_matrix(row, col);
    Q_ASSERT(item);
    d->m_things.removeAt(index);
    d->m_matrix(row, col) = 0;

    invalidate();

    return ownershipCleanedItem(item, this);
}